

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer_impl.cpp
# Opt level: O0

tuple<bool,_float>
intersect_triangle(vector<float,_std::allocator<float>_> *origin,Vector3f *ray,Vector3f *e1,
                  Vector3f *e2,Vector3f *v0)

{
  float fVar1;
  CommaInitializer<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this;
  Scalar *pSVar2;
  Index in_R9;
  undefined1 local_141;
  tuple<bool,_double> local_140;
  undefined4 local_130;
  undefined1 local_129;
  float *local_128;
  Matrix<float,3,1,0,3,1> local_11c [12];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  local_110;
  HouseholderQR<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> local_f8;
  Solve<Eigen::HouseholderQR<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  local_b8;
  Matrix<float,3,1,0,3,1> local_a4 [8];
  Vector3f x;
  CommaInitializer<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> local_78;
  int local_58 [2];
  undefined1 local_50 [8];
  MatrixXf A;
  Vector3f *v0_local;
  Vector3f *e2_local;
  Vector3f *e1_local;
  Vector3f *ray_local;
  vector<float,_std::allocator<float>_> *origin_local;
  
  local_58[1] = 3;
  local_58[0] = 3;
  A.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols = in_R9;
  Eigen::Matrix<float,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<float,_1,_1,0,_1,_1> *)local_50,local_58 + 1,local_58);
  Eigen::DenseBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::operator<<
            (&local_78,(DenseBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_50,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)e2);
  this = Eigen::CommaInitializer<Eigen::Matrix<float,-1,-1,0,-1,-1>>::operator_
                   ((CommaInitializer<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&local_78,
                    (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)v0);
  Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator-
            ((NegativeReturnType *)
             (x.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
             1),(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)e1);
  Eigen::CommaInitializer<Eigen::Matrix<float,-1,-1,0,-1,-1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)this,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              *)(x.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array + 1));
  Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_78);
  Eigen::MatrixBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::householderQr
            (&local_f8,(MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_50);
  local_128 = std::vector<float,_std::allocator<float>_>::data
                        ((vector<float,_std::allocator<float>_> *)ray);
  Eigen::Matrix<float,3,1,0,3,1>::Matrix<float_const*>(local_11c,&local_128);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
            (&local_110,(MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)local_11c,
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             A.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  local_b8 = Eigen::SolverBase<Eigen::HouseholderQR<Eigen::Matrix<float,-1,-1,0,-1,-1>>>::
             solve<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
                       ((SolverBase<Eigen::HouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>>> *)
                        &local_f8,
                        (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                         *)&local_110);
  Eigen::Matrix<float,3,1,0,3,1>::
  Matrix<Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>>
            (local_a4,&local_b8);
  Eigen::HouseholderQR<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::~HouseholderQR(&local_f8);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)local_a4,0);
  if (0.0 <= *pSVar2) {
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)local_a4,1);
    if (0.0 <= *pSVar2) {
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)local_a4,0);
      fVar1 = *pSVar2;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)local_a4,1);
      if (fVar1 + *pSVar2 <= 1.0) {
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)local_a4,2);
        if (0.0 < *pSVar2) {
          local_129 = 1;
          Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                    ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)local_a4,2);
          std::make_tuple<bool,float&>((bool *)origin,(float *)&local_129);
          goto LAB_00242c80;
        }
      }
    }
  }
  local_141 = 0;
  std::make_tuple<bool,double>((bool *)&local_140,(double *)&local_141);
  std::tuple<bool,_float>::tuple<bool,_double,_true>((tuple<bool,_float> *)origin,&local_140);
LAB_00242c80:
  local_130 = 1;
  Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<float,__1,__1,_0,__1,__1> *)local_50);
  return (tuple<bool,_float>)(_Tuple_impl<0UL,_bool,_float>)origin;
}

Assistant:

std::tuple<bool, float> intersect_triangle(
		std::vector<float> const& origin,
		Eigen::Vector3f const& ray,
		Eigen::Vector3f const& e1,
		Eigen::Vector3f const& e2,
		Eigen::Vector3f const& v0) {
	using namespace Eigen;
	auto A = MatrixXf(3, 3);
	A << e1, e2, -ray;
	auto x = static_cast<Vector3f>(A.householderQr().solve(Vector3f(origin.data())-v0));
	if(0 <= x[0] && 0 <= x[1] && x[0]+x[1] <= 1.0 && 0 < x[2]) {
		return std::make_tuple(true, x[2]);
	}
	return std::make_tuple(false, 0.0);
}